

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateKotlinMembers
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  string sStack_d8;
  string local_b8;
  ImmutableMessageGenerator local_98;
  
  ClassNameResolver::GetKotlinFactoryName_abi_cxx11_
            ((string *)&local_98,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  ClassNameResolver::GetKotlinExtensionsClassName_abi_cxx11_
            (&sStack_d8,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_b8,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  io::Printer::
  Print<char[15],std::__cxx11::string,char[11],std::__cxx11::string,char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\npublic inline fun $camelcase_name$(block: $message_kt$.Dsl.() -> kotlin.Unit): $message$ =\n  $message_kt$.Dsl._create($message$.newBuilder()).apply { block() }._build()\n"
             ,(char (*) [15])"camelcase_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
             (char (*) [11])"message_kt",&sStack_d8,(char (*) [8])0x409be2,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&local_98);
  io::Printer::Print<char[5],std::__cxx11::string>
            (printer,"public object $name$Kt {\n",(char (*) [5])0x3de831,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((this->super_MessageGenerator).descriptor_ + 8));
  io::Printer::Indent(printer);
  (*(this->super_MessageGenerator)._vptr_MessageGenerator[7])(this,printer);
  lVar3 = 0;
  for (lVar4 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_,
      lVar4 < *(int *)(pDVar1 + 0x70); lVar4 = lVar4 + 1) {
    lVar2 = *(long *)(pDVar1 + 0x38);
    if (*(char *)(*(long *)(lVar2 + 0x20 + lVar3) + 0x4b) == '\0') {
      ImmutableMessageGenerator(&local_98,(Descriptor *)(lVar2 + lVar3),this->context_);
      GenerateKotlinMembers(&local_98,printer);
      ~ImmutableMessageGenerator(&local_98);
    }
    lVar3 = lVar3 + 0x88;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateKotlinMembers(
    io::Printer* printer) const {
  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "public inline fun $camelcase_name$(block: $message_kt$.Dsl.() -> "
      "kotlin.Unit): "
      "$message$ "
      "=\n"
      "  $message_kt$.Dsl._create($message$.newBuilder()).apply { block() "
      "}._build()\n",
      "camelcase_name", name_resolver_->GetKotlinFactoryName(descriptor_),
      "message_kt", name_resolver_->GetKotlinExtensionsClassName(descriptor_),
      "message", name_resolver_->GetClassName(descriptor_, true));

  printer->Print("public object $name$Kt {\n", "name", descriptor_->name());
  printer->Indent();
  GenerateKotlinDsl(printer);
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator(descriptor_->nested_type(i), context_)
        .GenerateKotlinMembers(printer);
  }
  printer->Outdent();
  printer->Print("}\n");
}